

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O0

void dic_delete(dictionary *dic)

{
  int local_14;
  int i;
  dictionary *dic_local;
  
  for (local_14 = 0; local_14 < dic->length; local_14 = local_14 + 1) {
    if (dic->table[local_14] != (keynode *)0x0) {
      keynode_delete(dic->table[local_14]);
    }
  }
  free(dic->table);
  dic->table = (keynode **)0x0;
  free(dic);
  return;
}

Assistant:

void dic_delete(struct dictionary* dic) {
	for (int i = 0; i < dic->length; i++) {
		if (dic->table[i])
			keynode_delete(dic->table[i]);
	}
	free(dic->table);
	dic->table = 0;
	free(dic);
}